

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,DictionaryPropertyDescriptor<int> *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  lVar4 = *(long *)this;
  uVar3 = 0;
  if (lVar4 != 0) {
    uVar3 = BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((*key)->hash * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar5 = *(uint *)(lVar4 + (ulong)uVar3 * 4);
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      lVar4 = *(long *)(this + 8);
      uVar3 = 0;
      do {
        lVar6 = (ulong)uVar5 * 0x20;
        if (*(PropertyRecord **)(lVar4 + 0x18 + lVar6) == *key) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar3);
            lVar4 = *(long *)(this + 8);
          }
          uVar1 = *(undefined8 *)(lVar4 + lVar6);
          uVar2 = ((undefined8 *)(lVar4 + lVar6))[1];
          value->flags = (char)uVar1;
          value->Attributes = (char)((ulong)uVar1 >> 8);
          *(short *)&value->field_0x2 = (short)((ulong)uVar1 >> 0x10);
          value->Data = (int)((ulong)uVar1 >> 0x20);
          value->Getter = (int)uVar2;
          value->Setter = (int)((ulong)uVar2 >> 0x20);
          return true;
        }
        uVar3 = uVar3 + 1;
        uVar5 = *(uint *)(lVar6 + lVar4 + 0x10);
      } while (-1 < (int)uVar5);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar3);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }